

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_j2k_t * opj_j2k_create_decompress(void)

{
  int num_threads;
  opj_tcp_t *poVar1;
  OPJ_BYTE *pOVar2;
  opj_codestream_index_t *poVar3;
  opj_procedure_list_t *poVar4;
  opj_thread_pool_t *poVar5;
  opj_j2k_t *l_j2k;
  
  l_j2k = (opj_j2k_t *)opj_calloc(1,0x150);
  if (l_j2k == (opj_j2k_t *)0x0) {
    l_j2k = (opj_j2k_t *)0x0;
  }
  else {
    l_j2k->m_is_decoder = 1;
    (l_j2k->m_cp).field_0x90 = (l_j2k->m_cp).field_0x90 & 0xfd | 2;
    (l_j2k->m_cp).field_0x90 = (l_j2k->m_cp).field_0x90 & 0xfb | 4;
    poVar1 = (opj_tcp_t *)opj_calloc(1,0x1640);
    (l_j2k->m_specific_param).m_decoder.m_default_tcp = poVar1;
    if ((l_j2k->m_specific_param).m_decoder.m_default_tcp == (opj_tcp_t *)0x0) {
      opj_j2k_destroy(l_j2k);
      l_j2k = (opj_j2k_t *)0x0;
    }
    else {
      pOVar2 = (OPJ_BYTE *)opj_calloc(1,1000);
      (l_j2k->m_specific_param).m_decoder.m_header_data = pOVar2;
      if ((l_j2k->m_specific_param).m_decoder.m_header_data == (OPJ_BYTE *)0x0) {
        opj_j2k_destroy(l_j2k);
        l_j2k = (opj_j2k_t *)0x0;
      }
      else {
        (l_j2k->m_specific_param).m_decoder.m_header_data_size = 1000;
        (l_j2k->m_specific_param).m_decoder.m_tile_ind_to_dec = -1;
        (l_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        poVar3 = opj_j2k_create_cstr_index();
        l_j2k->cstr_index = poVar3;
        if (l_j2k->cstr_index == (opj_codestream_index_t *)0x0) {
          opj_j2k_destroy(l_j2k);
          l_j2k = (opj_j2k_t *)0x0;
        }
        else {
          poVar4 = opj_procedure_list_create();
          l_j2k->m_validation_list = poVar4;
          if (l_j2k->m_validation_list == (opj_procedure_list_t *)0x0) {
            opj_j2k_destroy(l_j2k);
            l_j2k = (opj_j2k_t *)0x0;
          }
          else {
            poVar4 = opj_procedure_list_create();
            l_j2k->m_procedure_list = poVar4;
            if (l_j2k->m_procedure_list == (opj_procedure_list_t *)0x0) {
              opj_j2k_destroy(l_j2k);
              l_j2k = (opj_j2k_t *)0x0;
            }
            else {
              num_threads = opj_j2k_get_default_thread_count();
              poVar5 = opj_thread_pool_create(num_threads);
              l_j2k->m_tp = poVar5;
              if (l_j2k->m_tp == (opj_thread_pool_t *)0x0) {
                poVar5 = opj_thread_pool_create(0);
                l_j2k->m_tp = poVar5;
              }
              if (l_j2k->m_tp == (opj_thread_pool_t *)0x0) {
                opj_j2k_destroy(l_j2k);
                l_j2k = (opj_j2k_t *)0x0;
              }
            }
          }
        }
      }
    }
  }
  return l_j2k;
}

Assistant:

opj_j2k_t* opj_j2k_create_decompress(void)
{
    opj_j2k_t *l_j2k = (opj_j2k_t*) opj_calloc(1, sizeof(opj_j2k_t));
    if (!l_j2k) {
        return 00;
    }

    l_j2k->m_is_decoder = 1;
    l_j2k->m_cp.m_is_decoder = 1;
    /* in the absence of JP2 boxes, consider different bit depth / sign */
    /* per component is allowed */
    l_j2k->m_cp.allow_different_bit_depth_sign = 1;

#ifdef OPJ_DISABLE_TPSOT_FIX
    l_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked = 1;
#endif

    l_j2k->m_specific_param.m_decoder.m_default_tcp = (opj_tcp_t*) opj_calloc(1,
            sizeof(opj_tcp_t));
    if (!l_j2k->m_specific_param.m_decoder.m_default_tcp) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    l_j2k->m_specific_param.m_decoder.m_header_data = (OPJ_BYTE *) opj_calloc(1,
            OPJ_J2K_DEFAULT_HEADER_SIZE);
    if (! l_j2k->m_specific_param.m_decoder.m_header_data) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    l_j2k->m_specific_param.m_decoder.m_header_data_size =
        OPJ_J2K_DEFAULT_HEADER_SIZE;

    l_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = -1 ;

    l_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = 0 ;

    /* codestream index creation */
    l_j2k->cstr_index = opj_j2k_create_cstr_index();
    if (!l_j2k->cstr_index) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    /* validation list creation */
    l_j2k->m_validation_list = opj_procedure_list_create();
    if (! l_j2k->m_validation_list) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    /* execution list creation */
    l_j2k->m_procedure_list = opj_procedure_list_create();
    if (! l_j2k->m_procedure_list) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    l_j2k->m_tp = opj_thread_pool_create(opj_j2k_get_default_thread_count());
    if (!l_j2k->m_tp) {
        l_j2k->m_tp = opj_thread_pool_create(0);
    }
    if (!l_j2k->m_tp) {
        opj_j2k_destroy(l_j2k);
        return NULL;
    }

    return l_j2k;
}